

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationTest.cpp
# Opt level: O2

void __thiscall ninx_evaluation::test_operator_spacing::test_method(test_operator_spacing *this)

{
  allocator local_81;
  undefined1 local_80 [24];
  char *local_68;
  string output;
  char *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  
  std::__cxx11::string::string
            ((string *)local_80,
             "\n@func bold($body) {\\<b\\>$body\\<\\/b\\>}\n@operator bold *\n\nFirst *test* second\n"
             ,&local_81);
  eval(&output,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::locale::locale((locale *)local_80);
  boost::algorithm::trim<std::__cxx11::string>(&output,(locale *)local_80);
  std::locale::~locale((locale *)local_80);
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/evaluation/EvaluationTest.cpp"
  ;
  local_18 = "";
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_28 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x17f);
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_001feb80;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/test/evaluation/EvaluationTest.cpp"
  ;
  local_38 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[25]>
            (local_80,&local_40,0x17f,1,2,&output,"output","First <b>test</b> second",
             "\"First <b>test</b> second\"");
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_operator_spacing) {
        auto output{eval(
                R"NINX(
@func bold($body) {\<b\>$body\<\/b\>}
@operator bold *

First *test* second
)NINX"
        )};

        boost::trim(output);



        BOOST_CHECK_EQUAL(output, "First <b>test</b> second");
    }